

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkInitialSetup(ARKodeMem ark_mem,sunrealtype tout)

{
  int iVar1;
  int iVar2;
  ARKInterp p_Var3;
  ARKodeMem in_RDI;
  void *in_XMM0_Qa;
  double dVar4;
  int conOK;
  sunrealtype htmp;
  sunrealtype rh;
  sunrealtype tout_hin;
  int istate;
  int hflag;
  int retval;
  sunrealtype in_stack_00000050;
  ARKodeMem in_stack_00000058;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  ARKodeMem in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  ARKodeMem in_stack_ffffffffffffffc0;
  ARKodeMem_conflict in_stack_ffffffffffffffc8;
  uint local_4;
  
  if (((in_RDI->fixedstep == 0) || (in_RDI->hin != 0.0)) || (NAN(in_RDI->hin))) {
    iVar1 = arkCheckNvectorOptional
                      ((ARKodeMem)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (iVar1 == 0) {
      arkProcessError(in_RDI,-0x16,0x7c8,"arkInitialSetup",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                      ,"A required vector operation is not implemented.");
      local_4 = 0xffffffea;
    }
    else {
      if (in_RDI->tstopset != 0) {
        if ((in_RDI->h != 0.0) || (NAN(in_RDI->h))) {
          in_stack_ffffffffffffffb0 = (ARKodeMem)in_RDI->h;
        }
        else {
          in_stack_ffffffffffffffb0 = (ARKodeMem)((double)in_XMM0_Qa - in_RDI->tcur);
        }
        in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffb0;
        if ((in_RDI->tstop - in_RDI->tcur) * (double)in_stack_ffffffffffffffb0 <= 0.0) {
          arkProcessError((ARKodeMem)in_RDI->tstop,(int)in_RDI->tcur,(int)in_RDI,(char *)0xffffffea,
                          (char *)0x7d3,"arkInitialSetup",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                          ,
                          "The value tstop = %.15g is behind current t = %.15g in the direction of integration."
                         );
          return -0x16;
        }
      }
      iVar1 = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
      if ((in_RDI->constraintsSet == 0) ||
         (in_stack_ffffffffffffffbc = N_VConstrMask(in_RDI->constraints,in_RDI->yn,in_RDI->tempv1),
         in_stack_ffffffffffffffbc != 0)) {
        iVar2 = (*in_RDI->efun)(in_RDI->yn,in_RDI->ewt,in_RDI->e_data);
        if (iVar2 == 0) {
          if (in_RDI->step_init == (ARKTimestepInitFn)0x0) {
            arkProcessError(in_RDI,-0x16,0x7f9,"arkInitialSetup",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                            ,"Time stepper module is missing");
            local_4 = 0xffffffea;
          }
          else {
            local_4 = (*in_RDI->step_init)(in_RDI,(sunrealtype)in_XMM0_Qa,in_RDI->init_type);
            if (local_4 == 0) {
              if (in_RDI->rwt_is_ewt == 0) {
                iVar2 = (*in_RDI->rfun)(in_RDI->yn,in_RDI->rwt,in_RDI->r_data);
                if (iVar2 != 0) {
                  if (in_RDI->itol == 2) {
                    arkProcessError(in_RDI,-0x16,0x811,"arkInitialSetup",
                                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                                    ,"The user-provide RwtSet function failed.");
                  }
                  else {
                    arkProcessError(in_RDI,-0x16,0x816,"arkInitialSetup",
                                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                                    ,"Initial rwt has component(s) equal to zero (illegal).");
                  }
                  return -0x16;
                }
              }
              else {
                in_RDI->rwt = in_RDI->ewt;
              }
              if ((in_RDI->interp_type != -1) && (in_RDI->interp == (ARKInterp)0x0)) {
                if (in_RDI->interp_type == 1) {
                  p_Var3 = arkInterpCreate_Lagrange(in_stack_ffffffffffffffc8,iVar1);
                  in_RDI->interp = p_Var3;
                }
                else {
                  p_Var3 = arkInterpCreate_Hermite(in_stack_ffffffffffffffc8,iVar1);
                  in_RDI->interp = p_Var3;
                }
                if (in_RDI->interp == (ARKInterp)0x0) {
                  arkProcessError(in_RDI,-0x14,0x82a,"arkInitialSetup",
                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                                  ,"Unable to allocate interpolation module");
                  return -0x14;
                }
              }
              if (in_RDI->interp != (ARKInterp)0x0) {
                iVar1 = arkInterpSetDegree((ARKodeMem_conflict)
                                           CONCAT44(in_stack_ffffffffffffffbc,
                                                    in_stack_ffffffffffffffb8),
                                           (ARKInterp)in_stack_ffffffffffffffb0,
                                           in_stack_ffffffffffffffac);
                if (iVar1 != 0) {
                  arkProcessError(in_RDI,-0x16,0x836,"arkInitialSetup",
                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                                  ,"Unable to update interpolation polynomial degree");
                  return -0x16;
                }
                iVar1 = arkInterpInit((ARKodeMem_conflict)
                                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                      (ARKInterp)in_stack_ffffffffffffffb0,
                                      (sunrealtype)
                                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
                ;
                if (iVar1 != 0) {
                  arkProcessError(in_RDI,-0x16,0x83d,"arkInitialSetup",
                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                                  ,"Unable to initialize interpolation module");
                  return -0x16;
                }
              }
              if ((in_RDI->root_mem == (ARKodeRootMem)0x0) || (in_RDI->interp != (ARKInterp)0x0)) {
                if ((in_RDI->tstopinterp == 0) || (in_RDI->interp != (ARKInterp)0x0)) {
                  if ((in_RDI->call_fullrhs == 0) &&
                     (((((in_RDI->h0u != 0.0 || (NAN(in_RDI->h0u))) || (in_RDI->hin != 0.0)) ||
                       (NAN(in_RDI->hin))) && (in_RDI->root_mem == (ARKodeRootMem)0x0)))) {
                    if (in_RDI->fn != (N_Vector)0x0) {
                      arkFreeVec(in_stack_ffffffffffffffb0,
                                 (N_Vector *)
                                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
                    }
                    iVar2 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
                  }
                  else {
                    if (in_RDI->step_fullrhs == (ARKTimestepFullRHSFn)0x0) {
                      arkProcessError(in_RDI,-0x16,0x85b,"arkInitialSetup",
                                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                                      ,
                                      "Time-stepping module missing fullrhs routine (required by requested solver configuration)."
                                     );
                      return -0x16;
                    }
                    iVar1 = arkAllocVec((ARKodeMem)
                                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8
                                                ),(N_Vector)in_stack_ffffffffffffffb0,
                                        (N_Vector *)
                                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                                                ));
                    iVar2 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
                    if (iVar1 == 0) {
                      arkProcessError(in_RDI,-0x14,0x862,"arkInitialSetup",
                                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                                      ,"A memory request failed.");
                      return -0x14;
                    }
                  }
                  in_RDI->initialized = 1;
                  if ((in_RDI->h0u != 0.0) || (NAN(in_RDI->h0u))) {
                    if ((in_RDI->tstopset != 0) &&
                       (0.0 < ((in_RDI->tcur + in_RDI->hprime) - in_RDI->tstop) * in_RDI->h)) {
                      in_RDI->hprime =
                           (in_RDI->tstop - in_RDI->tcur) * (in_RDI->uround * -4.0 + 1.0);
                      in_RDI->eta = in_RDI->hprime / in_RDI->h;
                    }
                  }
                  else {
                    in_RDI->h = in_RDI->hin;
                    if (((in_RDI->h != 0.0) || (NAN(in_RDI->h))) &&
                       (((double)in_XMM0_Qa - in_RDI->tcur) * in_RDI->h < 0.0)) {
                      arkProcessError(in_RDI,-0x16,0x876,"arkInitialSetup",
                                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                                      ,"h0 and tout - t0 inconsistent.");
                      return -0x16;
                    }
                    if ((in_RDI->h != 0.0) || (NAN(in_RDI->h))) {
                      if (in_RDI->nst == 0) {
                        in_RDI->hadapt_mem->etamax = in_RDI->hadapt_mem->etamx1;
                      }
                      else {
                        in_RDI->hadapt_mem->etamax = in_RDI->hadapt_mem->growth;
                      }
                    }
                    else {
                      in_RDI->h = ABS((double)in_XMM0_Qa - in_RDI->tcur);
                      if ((in_RDI->h == 0.0) && (!NAN(in_RDI->h))) {
                        in_RDI->h = 1.0;
                      }
                      iVar1 = arkHin(in_stack_00000058,in_stack_00000050);
                      if (iVar1 != 0) {
                        iVar1 = arkHandleFailure((ARKodeMem)
                                                 CONCAT44(in_stack_ffffffffffffffbc,
                                                          in_stack_ffffffffffffffb8),iVar2);
                        return iVar1;
                      }
                      in_RDI->hadapt_mem->etamax = in_RDI->hadapt_mem->etamx1;
                    }
                    dVar4 = ABS(in_RDI->h) * in_RDI->hmax_inv;
                    if (1.0 < dVar4) {
                      in_RDI->h = in_RDI->h / dVar4;
                    }
                    if (ABS(in_RDI->h) < in_RDI->hmin) {
                      in_RDI->h = (in_RDI->hmin / ABS(in_RDI->h)) * in_RDI->h;
                    }
                    if ((in_RDI->tstopset != 0) &&
                       (0.0 < ((in_RDI->tcur + in_RDI->h) - in_RDI->tstop) * in_RDI->h)) {
                      in_RDI->h = (in_RDI->tstop - in_RDI->tcur) * (in_RDI->uround * -4.0 + 1.0);
                    }
                    in_RDI->h0u = in_RDI->h;
                    in_RDI->eta = 1.0;
                    in_RDI->hprime = in_RDI->h;
                  }
                  if (((in_RDI->root_mem == (ARKodeRootMem)0x0) || (in_RDI->root_mem->nrtfn < 1)) ||
                     (local_4 = arkRootCheck1(in_XMM0_Qa), local_4 == 0)) {
                    local_4 = 0;
                  }
                }
                else {
                  arkProcessError(in_RDI,-0x16,0x84d,"arkInitialSetup",
                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                                  ,"Stop time interpolation requires an interpolation module");
                  local_4 = 0xffffffea;
                }
              }
              else {
                arkProcessError(in_RDI,-0x16,0x846,"arkInitialSetup",
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                                ,"Rootfinding requires an interpolation module");
                local_4 = 0xffffffea;
              }
            }
            else {
              arkProcessError(in_RDI,(int)(ulong)local_4,0x800,"arkInitialSetup",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                              ,"Error in initialization of time stepper module");
            }
          }
        }
        else {
          if (in_RDI->itol == 2) {
            arkProcessError(in_RDI,-0x16,0x7eb,"arkInitialSetup",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                            ,"The user-provide EwtSet function failed.");
          }
          else {
            arkProcessError(in_RDI,-0x16,0x7f0,"arkInitialSetup",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                            ,"Initial ewt has component(s) equal to zero (illegal).");
          }
          local_4 = 0xffffffea;
        }
      }
      else {
        arkProcessError(in_RDI,-0x16,0x7df,"arkInitialSetup",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                        ,"y0 fails to satisfy constraints.");
        local_4 = 0xffffffea;
      }
    }
  }
  else {
    arkProcessError(in_RDI,-0x16,0x7bf,"arkInitialSetup",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"Fixed step mode enabled, but no step size set");
    local_4 = 0xffffffea;
  }
  return local_4;
}

Assistant:

int arkInitialSetup(ARKodeMem ark_mem, sunrealtype tout)
{
  int retval, hflag, istate;
  sunrealtype tout_hin, rh, htmp;
  sunbooleantype conOK;

  /* Check that user has supplied an initial step size if fixedstep mode is on */
  if ((ark_mem->fixedstep) && (ark_mem->hin == ZERO))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Fixed step mode enabled, but no step size set");
    return (ARK_ILL_INPUT);
  }

  /* Perform additional N_Vector checks here, now that ARKODE has been
     fully configured by the user */
  if (!arkCheckNvectorOptional(ark_mem))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_NVECTOR);
    return (ARK_ILL_INPUT);
  }

  /* Test input tstop for legality (correct direction of integration) */
  if (ark_mem->tstopset)
  {
    htmp = (ark_mem->h == ZERO) ? tout - ark_mem->tcur : ark_mem->h;
    if ((ark_mem->tstop - ark_mem->tcur) * htmp <= ZERO)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_ARK_BAD_TSTOP, ark_mem->tstop, ark_mem->tcur);
      return (ARK_ILL_INPUT);
    }
  }

  /* Check to see if y0 satisfies constraints */
  if (ark_mem->constraintsSet)
  {
    conOK = N_VConstrMask(ark_mem->constraints, ark_mem->yn, ark_mem->tempv1);
    if (!conOK)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_ARK_Y0_FAIL_CONSTR);
      return (ARK_ILL_INPUT);
    }
  }

  /* Load initial error weights */
  retval = ark_mem->efun(ark_mem->yn, ark_mem->ewt, ark_mem->e_data);
  if (retval != 0)
  {
    if (ark_mem->itol == ARK_WF)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_ARK_EWT_FAIL);
    }
    else
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_ARK_BAD_EWT);
    }
    return (ARK_ILL_INPUT);
  }

  /* Set up the time stepper module */
  if (ark_mem->step_init == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Time stepper module is missing");
    return (ARK_ILL_INPUT);
  }
  retval = ark_mem->step_init(ark_mem, tout, ark_mem->init_type);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Error in initialization of time stepper module");
    return (retval);
  }

  /* Load initial residual weights */
  if (ark_mem->rwt_is_ewt)
  { /* update pointer to ewt */
    ark_mem->rwt = ark_mem->ewt;
  }
  else
  {
    retval = ark_mem->rfun(ark_mem->yn, ark_mem->rwt, ark_mem->r_data);
    if (retval != 0)
    {
      if (ark_mem->itol == ARK_WF)
      {
        arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                        MSG_ARK_RWT_FAIL);
      }
      else
      {
        arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                        MSG_ARK_BAD_RWT);
      }
      return (ARK_ILL_INPUT);
    }
  }

  /* Create default interpolation module (if needed) */
  if (ark_mem->interp_type != ARK_INTERP_NONE && !(ark_mem->interp))
  {
    if (ark_mem->interp_type == ARK_INTERP_LAGRANGE)
    {
      ark_mem->interp = arkInterpCreate_Lagrange(ark_mem, ark_mem->interp_degree);
    }
    else
    {
      ark_mem->interp = arkInterpCreate_Hermite(ark_mem, ark_mem->interp_degree);
    }
    if (ark_mem->interp == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to allocate interpolation module");
      return ARK_MEM_FAIL;
    }
  }

  /* Fill initial interpolation data (if needed) */
  if (ark_mem->interp != NULL)
  {
    /* Stepper init may have limited the interpolation degree */
    if (arkInterpSetDegree(ark_mem, ark_mem->interp, ark_mem->interp_degree))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Unable to update interpolation polynomial degree");
      return ARK_ILL_INPUT;
    }

    if (arkInterpInit(ark_mem, ark_mem->interp, ark_mem->tcur))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Unable to initialize interpolation module");
      return ARK_ILL_INPUT;
    }
  }

  /* Check if the configuration requires interpolation */
  if (ark_mem->root_mem && !(ark_mem->interp))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Rootfinding requires an interpolation module");
    return ARK_ILL_INPUT;
  }

  if (ark_mem->tstopinterp && !(ark_mem->interp))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Stop time interpolation requires an interpolation module");
    return ARK_ILL_INPUT;
  }

  /* If fullrhs will be called (to estimate initial step, explicit steppers, Hermite
     interpolation module, and possibly (but not always) arkRootCheck1), then
     ensure that it is provided, and space is allocated for fn.  Otherwise,
     we should free ark_mem->fn if it is allocated. */
  if (ark_mem->call_fullrhs || (ark_mem->h0u == ZERO && ark_mem->hin == ZERO) ||
      ark_mem->root_mem)
  {
    if (!ark_mem->step_fullrhs)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_ARK_MISSING_FULLRHS);
      return ARK_ILL_INPUT;
    }

    if (!arkAllocVec(ark_mem, ark_mem->yn, &ark_mem->fn))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_MEM_FAIL);
      return (ARK_MEM_FAIL);
    }
  }
  else
  {
    if (ark_mem->fn != NULL) { arkFreeVec(ark_mem, &ark_mem->fn); }
  }

  /* initialization complete */
  ark_mem->initialized = SUNTRUE;

  /* Set initial step size */
  if (ark_mem->h0u == ZERO)
  {
    /* Check input h for validity */
    ark_mem->h = ark_mem->hin;
    if ((ark_mem->h != ZERO) && ((tout - ark_mem->tcur) * ark_mem->h < ZERO))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_ARK_BAD_H0);
      return (ARK_ILL_INPUT);
    }

    /* Estimate initial h if not set */
    if (ark_mem->h == ZERO)
    {
      /* If necessary, temporarily set h as it is used to compute the tolerance
         in a potential mass matrix solve when computing the full rhs */
      ark_mem->h = SUNRabs(tout - ark_mem->tcur);
      if (ark_mem->h == ZERO) { ark_mem->h = ONE; }

      /* Estimate the first step size */
      tout_hin = tout;
      if (ark_mem->tstopset &&
          (tout - ark_mem->tcur) * (tout - ark_mem->tstop) > ZERO)
      {
        tout_hin = ark_mem->tstop;
      }
      hflag = arkHin(ark_mem, tout_hin);
      if (hflag != ARK_SUCCESS)
      {
        istate = arkHandleFailure(ark_mem, hflag);
        return (istate);
      }

      /* Use first step growth factor for estimated h */
      ark_mem->hadapt_mem->etamax = ark_mem->hadapt_mem->etamx1;
    }
    else if (ark_mem->nst == 0)
    {
      /* Use first step growth factor for user defined h */
      ark_mem->hadapt_mem->etamax = ark_mem->hadapt_mem->etamx1;
    }
    else
    {
      /* Use standard growth factor (e.g., for reset) */
      ark_mem->hadapt_mem->etamax = ark_mem->hadapt_mem->growth;
    }

    /* Enforce step size bounds */
    rh = SUNRabs(ark_mem->h) * ark_mem->hmax_inv;
    if (rh > ONE) { ark_mem->h /= rh; }
    if (SUNRabs(ark_mem->h) < ark_mem->hmin)
    {
      ark_mem->h *= ark_mem->hmin / SUNRabs(ark_mem->h);
    }

    /* Check for approach to tstop */
    if (ark_mem->tstopset)
    {
      if ((ark_mem->tcur + ark_mem->h - ark_mem->tstop) * ark_mem->h > ZERO)
      {
        ark_mem->h = (ark_mem->tstop - ark_mem->tcur) *
                     (ONE - FOUR * ark_mem->uround);
      }
    }

    /* Set initial time step factors */
    ark_mem->h0u    = ark_mem->h;
    ark_mem->eta    = ONE;
    ark_mem->hprime = ark_mem->h;
  }
  else
  {
    /* If next step would overtake tstop, adjust stepsize */
    if (ark_mem->tstopset)
    {
      if ((ark_mem->tcur + ark_mem->hprime - ark_mem->tstop) * ark_mem->h > ZERO)
      {
        ark_mem->hprime = (ark_mem->tstop - ark_mem->tcur) *
                          (ONE - FOUR * ark_mem->uround);
        ark_mem->eta = ark_mem->hprime / ark_mem->h;
      }
    }
  }

  /* Check for zeros of root function g at and near t0. */
  if (ark_mem->root_mem != NULL)
  {
    if (ark_mem->root_mem->nrtfn > 0)
    {
      retval = arkRootCheck1((void*)ark_mem);
      if (retval != ARK_SUCCESS) { return retval; }
    }
  }

  return (ARK_SUCCESS);
}